

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_closed_fd_events(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b_1;
  int64_t eval_b_4;
  uv_os_fd_t fd [2];
  undefined1 local_2f8 [16];
  uv_fs_t req;
  uv_pipe_t pipe_handle;
  uv_stdio_container_t stdio [3];
  
  local_2f8 = uv_buf_init("",1);
  iVar1 = uv_pipe(fd,0,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x73c,"0 == uv_pipe(fd, 0, 0)");
    abort();
  }
  init_process_options("spawn_helper4",exit_cb);
  options.stdio_count = 3;
  options.stdio = stdio;
  stdio[0].flags = UV_INHERIT_FD;
  stdio[0].data.file = fd[0];
  stdio[1].flags = UV_IGNORE;
  stdio[2].flags = UV_IGNORE;
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  req.data = (void *)(long)iVar1;
  pipe_handle.data = (void *)0x0;
  if (req.data == (void *)0x0) {
    uv_unref(&process);
    uVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar2,&pipe_handle,0);
    req.data = (void *)(long)iVar1;
    if (req.data == (void *)0x0) {
      iVar1 = uv_pipe_open(&pipe_handle,fd[0]);
      req.data = (void *)(long)iVar1;
      if (req.data == (void *)0x0) {
        fd[0] = -1;
        iVar1 = uv_read_start(&pipe_handle,on_alloc,on_read_once);
        req.data = (void *)(long)iVar1;
        if (req.data == (void *)0x0) {
          eval_b_1 = 1;
          iVar1 = uv_fs_write(0,&req,fd[1],local_2f8,1,0xffffffffffffffff);
          eval_b_4 = (int64_t)iVar1;
          if (eval_b_4 == 1) {
            eval_b_1 = 1;
            if (req.result == 1) {
              uv_fs_req_cleanup(&req);
              uVar2 = uv_default_loop();
              iVar1 = uv_run(uVar2,1);
              eval_b_1 = (int64_t)iVar1;
              eval_b_4 = 0;
              if ((void *)eval_b_1 == (void *)0x0) {
                eval_b_1 = 1;
                eval_b_4 = (int64_t)output_used;
                if (eval_b_4 == 1) {
                  uv_close(&pipe_handle,close_cb);
                  eval_b_1 = 1;
                  iVar1 = uv_fs_write(0,&req,fd[1],local_2f8,1,0xffffffffffffffff);
                  eval_b_4 = (int64_t)iVar1;
                  if (eval_b_4 == 1) {
                    eval_b_1 = 1;
                    if (req.result == 1) {
                      uv_fs_req_cleanup(&req);
                      uVar2 = uv_default_loop();
                      iVar1 = uv_timer_init(uVar2,&timer);
                      eval_b_1 = (int64_t)iVar1;
                      eval_b_4 = 0;
                      if ((void *)eval_b_1 == (void *)0x0) {
                        iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
                        eval_b_1 = (int64_t)iVar1;
                        eval_b_4 = 0;
                        if ((void *)eval_b_1 == (void *)0x0) {
                          uVar2 = uv_default_loop();
                          iVar1 = uv_run(uVar2,1);
                          if (iVar1 == 1) {
                            uVar2 = uv_default_loop();
                            iVar1 = uv_run(uVar2,1);
                            eval_b_1 = (int64_t)iVar1;
                            eval_b_4 = 0;
                            if ((void *)eval_b_1 != (void *)0x0) {
                              pcVar4 = "0";
                              pcVar3 = "uv_run(uv_default_loop(), UV_RUN_ONCE)";
                              uVar2 = 0x76e;
                              goto LAB_0017ca92;
                            }
                          }
                          eval_b_1 = 1;
                          eval_b_4 = (int64_t)timer_counter;
                          if (eval_b_4 == 1) {
                            iVar1 = uv_process_kill(&process,0xf);
                            eval_b_1 = (int64_t)iVar1;
                            eval_b_4 = 0;
                            if ((void *)eval_b_1 == (void *)0x0) {
                              iVar1 = close(fd[1]);
                              eval_b_1 = (int64_t)iVar1;
                              eval_b_4 = 0;
                              if ((void *)eval_b_1 == (void *)0x0) {
                                fd[1] = -1;
                                loop = (uv_loop_t *)uv_default_loop();
                                close_loop(loop);
                                eval_b_1 = 0;
                                uVar2 = uv_default_loop();
                                iVar1 = uv_loop_close(uVar2);
                                eval_b_4 = (int64_t)iVar1;
                                if (eval_b_4 == 0) {
                                  uv_library_shutdown();
                                  return 0;
                                }
                                pcVar4 = "uv_loop_close(uv_default_loop())";
                                pcVar3 = "0";
                                uVar2 = 0x77c;
                              }
                              else {
                                pcVar4 = "0";
                                pcVar3 = "close(fd[1])";
                                uVar2 = 0x778;
                              }
                            }
                            else {
                              pcVar4 = "0";
                              pcVar3 = "uv_process_kill(&process, 15)";
                              uVar2 = 0x773;
                            }
                          }
                          else {
                            pcVar4 = "timer_counter";
                            pcVar3 = "1";
                            uVar2 = 0x770;
                          }
                        }
                        else {
                          pcVar4 = "0";
                          pcVar3 = "uv_timer_start(&timer, timer_counter_cb, 10, 0)";
                          uVar2 = 0x769;
                        }
                      }
                      else {
                        pcVar4 = "0";
                        pcVar3 = "uv_timer_init(uv_default_loop(), &timer)";
                        uVar2 = 0x768;
                      }
                    }
                    else {
                      pcVar4 = "req.result";
                      pcVar3 = "1";
                      uVar2 = 0x765;
                      eval_b_4 = req.result;
                    }
                  }
                  else {
                    pcVar4 = "uv_fs_write(((void*)0), &req, fd[1], bufs, 1, -1, ((void*)0))";
                    pcVar3 = "1";
                    uVar2 = 0x764;
                  }
                }
                else {
                  pcVar4 = "output_used";
                  pcVar3 = "1";
                  uVar2 = 0x75f;
                }
              }
              else {
                pcVar4 = "0";
                pcVar3 = "uv_run(uv_default_loop(), UV_RUN_ONCE)";
                uVar2 = 0x75c;
              }
            }
            else {
              pcVar4 = "req.result";
              pcVar3 = "1";
              uVar2 = 0x759;
              eval_b_4 = req.result;
            }
          }
          else {
            pcVar4 = "uv_fs_write(((void*)0), &req, fd[1], bufs, 1, -1, ((void*)0))";
            pcVar3 = "1";
            uVar2 = 0x758;
          }
          goto LAB_0017ca92;
        }
        pcVar3 = "uv_read_start((uv_stream_t*) &pipe_handle, on_alloc, on_read_once)";
        uVar2 = 0x756;
      }
      else {
        pcVar3 = "uv_pipe_open(&pipe_handle, fd[0])";
        uVar2 = 0x74c;
      }
    }
    else {
      pcVar3 = "uv_pipe_init(uv_default_loop(), &pipe_handle, 0)";
      uVar2 = 0x74b;
    }
  }
  else {
    pcVar3 = "uv_spawn(uv_default_loop(), &process, &options)";
    uVar2 = 0x747;
  }
  eval_b_4 = 0;
  pcVar4 = "0";
  eval_b_1 = (int64_t)req.data;
LAB_0017ca92:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b_1,"==",eval_b_4);
  abort();
}

Assistant:

TEST_IMPL(closed_fd_events) {
  uv_stdio_container_t stdio[3];
  uv_pipe_t pipe_handle;
  uv_fs_t req;
  uv_buf_t bufs[1];
  uv_os_fd_t fd[2];
  bufs[0] = uv_buf_init("", 1);

  /* create a pipe and share it with a child process */
  ASSERT(0 == uv_pipe(fd, 0, 0));

  /* spawn_helper4 blocks indefinitely. */
  init_process_options("spawn_helper4", exit_cb);
  options.stdio_count = 3;
  options.stdio = stdio;
  options.stdio[0].flags = UV_INHERIT_FD;
  options.stdio[0].data.file = fd[0];
  options.stdio[1].flags = UV_IGNORE;
  options.stdio[2].flags = UV_IGNORE;

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));
  uv_unref((uv_handle_t*) &process);

  /* read from the pipe with uv */
  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pipe_handle, 0));
  ASSERT_OK(uv_pipe_open(&pipe_handle, fd[0]));
  /* uv_pipe_open() takes ownership of the file descriptor. */
#ifdef _WIN32
  fd[0] = INVALID_HANDLE_VALUE;
#else
  fd[0] = -1;
#endif

  ASSERT_OK(uv_read_start((uv_stream_t*) &pipe_handle,
                          on_alloc,
                          on_read_once));

  ASSERT_EQ(1, uv_fs_write(NULL, &req, fd[1], bufs, 1, -1, NULL));
  ASSERT_EQ(1, req.result);
  uv_fs_req_cleanup(&req);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_ONCE));

  /* should have received just one byte */
  ASSERT_EQ(1, output_used);

  /* close the pipe and see if we still get events */
  uv_close((uv_handle_t*) &pipe_handle, close_cb);

  ASSERT_EQ(1, uv_fs_write(NULL, &req, fd[1], bufs, 1, -1, NULL));
  ASSERT_EQ(1, req.result);
  uv_fs_req_cleanup(&req);

  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_counter_cb, 10, 0));

  /* see if any spurious events interrupt the timer */
  if (1 == uv_run(uv_default_loop(), UV_RUN_ONCE))
    /* have to run again to really trigger the timer */
    ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_ONCE));

  ASSERT_EQ(1, timer_counter);

  /* cleanup */
  ASSERT_OK(uv_process_kill(&process, SIGTERM));
#ifdef _WIN32
  ASSERT_NE(0, CloseHandle(fd[1]));
  fd[1] = INVALID_HANDLE_VALUE;
#else
  ASSERT_OK(close(fd[1]));
  fd[1] = -1;
#endif

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}